

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# param.c
# Opt level: O0

char * stumpless_get_param_value(stumpless_param *param)

{
  char *value_copy;
  stumpless_param *param_local;
  
  if (param == (stumpless_param *)0x0) {
    raise_argument_empty("param was NULL");
    param_local = (stumpless_param *)0x0;
  }
  else {
    lock_param(param);
    param_local = (stumpless_param *)alloc_mem(param->value_length + 1);
    if (param_local != (stumpless_param *)0x0) {
      memcpy(param_local,param->value,param->value_length);
      param_local->name[param->value_length] = '\0';
      clear_error();
    }
    unlock_param(param);
  }
  return param_local->name;
}

Assistant:

const char *
stumpless_get_param_value( const struct stumpless_param *param ) {
  char *value_copy;

  VALIDATE_ARG_NOT_NULL( param );

  lock_param( param );
  value_copy = alloc_mem( param->value_length + 1 );
  if( !value_copy ) {
    goto cleanup_and_return;
  }
  memcpy( value_copy, param->value, param->value_length );
  value_copy[param->value_length] = '\0';
  clear_error(  );

cleanup_and_return:
  unlock_param( param );
  return value_copy;
}